

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

void pulse_destroy(cubeb_conflict *ctx)

{
  free(ctx->context_name);
  if (ctx->context != (pa_context *)0x0) {
    pulse_context_destroy(ctx);
  }
  if (ctx->mainloop != (pa_threaded_mainloop *)0x0) {
    (*cubeb_pa_threaded_mainloop_stop)(ctx->mainloop);
    (*cubeb_pa_threaded_mainloop_free)(ctx->mainloop);
  }
  if (ctx->device_ids != (cubeb_strings *)0x0) {
    cubeb_strings_destroy(ctx->device_ids);
  }
  if (ctx->libpulse != (void *)0x0) {
    dlclose();
  }
  free(ctx->default_sink_info);
  free(ctx);
  return;
}

Assistant:

static void
pulse_destroy(cubeb * ctx)
{
  free(ctx->context_name);
  if (ctx->context) {
    pulse_context_destroy(ctx);
  }

  if (ctx->mainloop) {
    WRAP(pa_threaded_mainloop_stop)(ctx->mainloop);
    WRAP(pa_threaded_mainloop_free)(ctx->mainloop);
  }

  if (ctx->device_ids) {
    cubeb_strings_destroy(ctx->device_ids);
  }

  if (ctx->libpulse) {
    dlclose(ctx->libpulse);
  }
  free(ctx->default_sink_info);
  free(ctx);
}